

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

int P_DetermineTranslucency(int lumpnum)

{
  int iVar1;
  char local_79 [8];
  char lumpname_1 [9];
  char lumpname [9];
  PalEntry newcolor2;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_50;
  byte local_49;
  PalEntry newcolor;
  BYTE index;
  FWadLump tranmap;
  int lumpnum_local;
  
  FWadCollection::OpenLumpNum((FWadLump *)&newcolor,&Wads,lumpnum);
  PalEntry::PalEntry((PalEntry *)&local_50.field_0);
  PalEntry::PalEntry((PalEntry *)(lumpname + 1));
  FWadLump::Seek((FWadLump *)&newcolor,(ulong)(ushort)GPalette._1280_2_,0);
  FWadLump::Read((FWadLump *)&newcolor,&local_49,1);
  local_50 = (anon_union_4_2_12391d7c_for_PalEntry_0)
             *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
              &GPalette.BaseColors[GPalette.Remap[local_49]].field_0.field_0;
  FWadLump::Seek((FWadLump *)&newcolor,
                 (ulong)(ushort)(GPalette._1280_2_ << 8 | (ushort)GPalette._1280_2_ >> 8),0);
  FWadLump::Read((FWadLump *)&newcolor,&local_49,1);
  lumpname._1_4_ = GPalette.BaseColors[GPalette.Remap[local_49]].field_0.field_0;
  if (lumpname[3] == -1) {
    iVar1 = FIntCVar::operator_cast_to_int(&developer);
    if (2 < iVar1) {
      lumpname[0] = '\0';
      FWadCollection::GetLumpName(&Wads,lumpname_1 + 8,lumpnum);
      Printf("%s appears to be additive translucency %d (%d%%)\n",lumpname_1 + 8,
             (ulong)local_50.field_0.r,(ulong)(((uint)local_50.field_0.r * 100) / 0xff));
    }
    tranmap.Lump._4_4_ = -(local_50.d >> 0x10 & 0xff);
  }
  else {
    iVar1 = FIntCVar::operator_cast_to_int(&developer);
    if (2 < iVar1) {
      lumpname_1[0] = '\0';
      FWadCollection::GetLumpName(&Wads,local_79,lumpnum);
      Printf("%s appears to be translucency %d (%d%%)\n",local_79,(ulong)local_50.field_0.r,
             (ulong)(((uint)local_50.field_0.r * 100) / 0xff));
    }
    tranmap.Lump._4_4_ = local_50.d >> 0x10 & 0xff;
  }
  lumpname_1[1] = '\x01';
  lumpname_1[2] = '\0';
  lumpname_1[3] = '\0';
  lumpname_1[4] = '\0';
  FWadLump::~FWadLump((FWadLump *)&newcolor);
  return tranmap.Lump._4_4_;
}

Assistant:

int P_DetermineTranslucency (int lumpnum)
{
	FWadLump tranmap = Wads.OpenLumpNum (lumpnum);
	BYTE index;
	PalEntry newcolor;
	PalEntry newcolor2;

	tranmap.Seek (GPalette.BlackIndex * 256 + GPalette.WhiteIndex, SEEK_SET);
	tranmap.Read (&index, 1);

	newcolor = GPalette.BaseColors[GPalette.Remap[index]];

	tranmap.Seek (GPalette.WhiteIndex * 256 + GPalette.BlackIndex, SEEK_SET);
	tranmap.Read (&index, 1);
	newcolor2 = GPalette.BaseColors[GPalette.Remap[index]];
	if (newcolor2.r == 255)	// if black on white results in white it's either
							// fully transparent or additive
	{
		if (developer >= DMSG_NOTIFY)
		{
			char lumpname[9];
			lumpname[8] = 0;
			Wads.GetLumpName (lumpname, lumpnum);
			Printf ("%s appears to be additive translucency %d (%d%%)\n", lumpname, newcolor.r,
				newcolor.r*100/255);
		}
		return -newcolor.r;
	}

	if (developer >= DMSG_NOTIFY)
	{
		char lumpname[9];
		lumpname[8] = 0;
		Wads.GetLumpName (lumpname, lumpnum);
		Printf ("%s appears to be translucency %d (%d%%)\n", lumpname, newcolor.r,
			newcolor.r*100/255);
	}
	return newcolor.r;
}